

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

int * Vga_ManLookup(Vta_Man_t *p,int iObj,int iFrame)

{
  Vta_Obj_t *pVVar1;
  int *piVar2;
  
  piVar2 = p->pBins + (int)((uint)((iFrame + iObj + 1) * (iFrame + iObj)) % (uint)p->nBins);
  while( true ) {
    pVVar1 = Vta_ManObj(p,*piVar2);
    if ((pVVar1 == (Vta_Obj_t *)0x0) || ((pVVar1->iObj == iObj && (pVVar1->iFrame == iFrame))))
    break;
    piVar2 = &pVVar1->iNext;
  }
  return piVar2;
}

Assistant:

static inline int * Vga_ManLookup( Vta_Man_t * p, int iObj, int iFrame )
{
    Vta_Obj_t * pThis;
    int * pPlace = p->pBins + Vga_ManHash( iObj, iFrame, p->nBins );
    for ( pThis = Vta_ManObj(p, *pPlace); 
          pThis;  pPlace = &pThis->iNext, 
          pThis = Vta_ManObj(p, *pPlace) )
        if ( pThis->iObj == iObj && pThis->iFrame == iFrame )
            break;
    return pPlace;
}